

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::setUseDesignMetrics(QTextDocument *this,bool b)

{
  QAbstractTextDocumentLayout *pQVar1;
  bool bVar2;
  int iVar3;
  QTextDocumentPrivate *pQVar4;
  byte in_SIL;
  QTextDocumentPrivate *d;
  
  pQVar4 = d_func((QTextDocument *)0x7ab2d0);
  bVar2 = QTextOption::useDesignMetrics(&pQVar4->defaultTextOption);
  if (((bool)(in_SIL & 1) != bVar2) &&
     (QTextOption::setUseDesignMetrics(&pQVar4->defaultTextOption,(bool)(in_SIL & 1)),
     pQVar4->lout != (QAbstractTextDocumentLayout *)0x0)) {
    pQVar1 = pQVar4->lout;
    iVar3 = QTextDocumentPrivate::length((QTextDocumentPrivate *)0x7ab348);
    (**(code **)(*(long *)pQVar1 + 0x90))(pQVar1,0,0,iVar3);
  }
  return;
}

Assistant:

void QTextDocument::setUseDesignMetrics(bool b)
{
    Q_D(QTextDocument);
    if (b == d->defaultTextOption.useDesignMetrics())
        return;
    d->defaultTextOption.setUseDesignMetrics(b);
    if (d->lout)
        d->lout->documentChanged(0, 0, d->length());
}